

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_shader_params_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,UsdPreviewSurface *shader,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  uint32_t indent_00;
  stringstream ss;
  string local_200;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = __return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:diffuseColor","");
  indent_00 = (uint32_t)shader;
  print_typed_attr<tinyusdz::value::color3f>
            (&local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
             (this + 0x730),&local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  paVar1 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:emissiveColor","");
  print_typed_attr<tinyusdz::value::color3f>
            (&local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
             (this + 0x9c8),&local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,"inputs:useSpecularWorkflow","");
  print_typed_attr<int>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<int>_> *)(this + 0xc60),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:ior","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x20b0),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:specularColor","");
  print_typed_attr<tinyusdz::value::color3f>
            (&local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *)
             (this + 0xee8),&local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:metallic","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1180),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:clearcoat","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1408),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,"inputs:clearcoatRoughness","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1690),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:roughness","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1918),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:opacity","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1ba0),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_200,"inputs:opacityThreshold","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x1e28),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:normal","");
  print_typed_attr<tinyusdz::value::normal3f>
            (&local_1e0,
             (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)
             (this + 0x2338),&local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:displacement","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x25d0),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"inputs:occlusion","");
  print_typed_attr<float>
            (&local_1e0,(TypedAttributeWithFallback<tinyusdz::Animatable<float>_> *)(this + 0x2858),
             &local_200,indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"outputs:surface","");
  print_typed_terminal_attr<tinyusdz::Token>
            (&local_1e0,(TypedTerminalAttribute<tinyusdz::Token> *)(this + 0x2ae0),&local_200,
             indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"outputs:displacement","");
  print_typed_terminal_attr<tinyusdz::Token>
            (&local_1e0,(TypedTerminalAttribute<tinyusdz::Token> *)(this + 0x2d10),&local_200,
             indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  print_common_shader_params_abi_cxx11_
            (&local_1e0,this,(ShaderNode *)((ulong)shader & 0xffffffff),indent_00);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  psVar2 = local_1c0;
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

static std::string print_shader_params(const UsdPreviewSurface &shader,
                                       const uint32_t indent) {
  std::stringstream ss;

  ss << print_typed_attr(shader.diffuseColor, "inputs:diffuseColor", indent);
  ss << print_typed_attr(shader.emissiveColor, "inputs:emissiveColor", indent);
  ss << print_typed_attr(shader.useSpecularWorkflow,
                         "inputs:useSpecularWorkflow", indent);
  ss << print_typed_attr(shader.ior, "inputs:ior", indent);
  ss << print_typed_attr(shader.specularColor, "inputs:specularColor", indent);
  ss << print_typed_attr(shader.metallic, "inputs:metallic", indent);
  ss << print_typed_attr(shader.clearcoat, "inputs:clearcoat", indent);
  ss << print_typed_attr(shader.clearcoatRoughness, "inputs:clearcoatRoughness",
                         indent);
  ss << print_typed_attr(shader.roughness, "inputs:roughness", indent);
  ss << print_typed_attr(shader.opacity, "inputs:opacity", indent);
  ss << print_typed_attr(shader.opacityThreshold, "inputs:opacityThreshold",
                         indent);
  ss << print_typed_attr(shader.normal, "inputs:normal", indent);
  ss << print_typed_attr(shader.displacement, "inputs:displacement", indent);
  ss << print_typed_attr(shader.occlusion, "inputs:occlusion", indent);

  ss << print_typed_terminal_attr(shader.outputsSurface, "outputs:surface",
                                  indent);
  ss << print_typed_terminal_attr(shader.outputsDisplacement,
                                  "outputs:displacement", indent);

  ss << print_common_shader_params(shader, indent);

  return ss.str();
}